

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ImplementsClauseSyntax::setChild
          (ImplementsClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->keyword).kind = TVar4.kind;
    (this->keyword).field_0x2 = TVar4._2_1_;
    (this->keyword).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->keyword).rawLen = TVar4.rawLen;
    (this->keyword).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->interfaces).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->interfaces).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->interfaces).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->interfaces).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->interfaces).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->interfaces).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->interfaces).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void ImplementsClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: interfaces = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}